

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O2

RK_S32 mpp_av1_assemble_fragment(AV1Context *ctx,Av1UnitFragment *frag)

{
  RK_U8 *pRVar1;
  RK_S32 RVar2;
  ulong uVar3;
  RK_U8 *pRVar4;
  ulong uVar5;
  long lVar6;
  size_t sVar7;
  size_t sVar8;
  long lVar9;
  
  uVar5 = 0;
  uVar3 = (ulong)(uint)frag->nb_units;
  if (frag->nb_units < 1) {
    uVar3 = uVar5;
  }
  sVar8 = 0;
  for (; uVar3 * 0x20 != uVar5; uVar5 = uVar5 + 0x20) {
    sVar8 = sVar8 + *(long *)((long)&frag->units->data_size + uVar5);
  }
  pRVar4 = (RK_U8 *)mpp_osal_malloc("mpp_av1_assemble_fragment",sVar8 + 0x40);
  frag->data = pRVar4;
  if (pRVar4 == (RK_U8 *)0x0) {
    RVar2 = -0x3ee;
  }
  else {
    pRVar1 = pRVar4 + sVar8 + 0x30;
    pRVar1[0] = '\0';
    pRVar1[1] = '\0';
    pRVar1[2] = '\0';
    pRVar1[3] = '\0';
    pRVar1[4] = '\0';
    pRVar1[5] = '\0';
    pRVar1[6] = '\0';
    pRVar1[7] = '\0';
    pRVar1[8] = '\0';
    pRVar1[9] = '\0';
    pRVar1[10] = '\0';
    pRVar1[0xb] = '\0';
    pRVar1[0xc] = '\0';
    pRVar1[0xd] = '\0';
    pRVar1[0xe] = '\0';
    pRVar1[0xf] = '\0';
    pRVar1 = pRVar4 + sVar8 + 0x20;
    pRVar1[0] = '\0';
    pRVar1[1] = '\0';
    pRVar1[2] = '\0';
    pRVar1[3] = '\0';
    pRVar1[4] = '\0';
    pRVar1[5] = '\0';
    pRVar1[6] = '\0';
    pRVar1[7] = '\0';
    pRVar1[8] = '\0';
    pRVar1[9] = '\0';
    pRVar1[10] = '\0';
    pRVar1[0xb] = '\0';
    pRVar1[0xc] = '\0';
    pRVar1[0xd] = '\0';
    pRVar1[0xe] = '\0';
    pRVar1[0xf] = '\0';
    pRVar1 = pRVar4 + sVar8 + 0x10;
    pRVar1[0] = '\0';
    pRVar1[1] = '\0';
    pRVar1[2] = '\0';
    pRVar1[3] = '\0';
    pRVar1[4] = '\0';
    pRVar1[5] = '\0';
    pRVar1[6] = '\0';
    pRVar1[7] = '\0';
    pRVar1[8] = '\0';
    pRVar1[9] = '\0';
    pRVar1[10] = '\0';
    pRVar1[0xb] = '\0';
    pRVar1[0xc] = '\0';
    pRVar1[0xd] = '\0';
    pRVar1[0xe] = '\0';
    pRVar1[0xf] = '\0';
    pRVar4 = pRVar4 + sVar8;
    pRVar4[0] = '\0';
    pRVar4[1] = '\0';
    pRVar4[2] = '\0';
    pRVar4[3] = '\0';
    pRVar4[4] = '\0';
    pRVar4[5] = '\0';
    pRVar4[6] = '\0';
    pRVar4[7] = '\0';
    pRVar4[8] = '\0';
    pRVar4[9] = '\0';
    pRVar4[10] = '\0';
    pRVar4[0xb] = '\0';
    pRVar4[0xc] = '\0';
    pRVar4[0xd] = '\0';
    pRVar4[0xe] = '\0';
    pRVar4[0xf] = '\0';
    lVar9 = 0x10;
    sVar7 = 0;
    for (lVar6 = 0; lVar6 < frag->nb_units; lVar6 = lVar6 + 1) {
      memcpy(frag->data + sVar7,*(void **)((long)frag->units + lVar9 + -8),
             *(size_t *)((long)&frag->units->type + lVar9));
      sVar7 = sVar7 + *(long *)((long)&frag->units->type + lVar9);
      lVar9 = lVar9 + 0x20;
    }
    if (sVar7 != sVar8) {
      _mpp_log_l(2,"av1d_cbs","Assertion %s failed at %s:%d\n",(char *)0x0,"pos == size",
                 "mpp_av1_assemble_fragment",0xc13);
      if ((mpp_debug._3_1_ & 0x10) != 0) {
        abort();
      }
    }
    frag->data_size = sVar8;
    RVar2 = 0;
  }
  return RVar2;
}

Assistant:

RK_S32 mpp_av1_assemble_fragment(AV1Context *ctx, Av1UnitFragment *frag)
{
    size_t size, pos;
    RK_S32 i;
    (void)ctx;
    size = 0;
    for (i = 0; i < frag->nb_units; i++)
        size += frag->units[i].data_size;

    frag->data = mpp_malloc(RK_U8, size + BUFFER_PADDING_SIZE);
    if (!frag->data)
        return MPP_ERR_NOMEM;

    memset(frag->data + size, 0, BUFFER_PADDING_SIZE);

    pos = 0;
    for (i = 0; i < frag->nb_units; i++) {
        memcpy(frag->data + pos, frag->units[i].data,
               frag->units[i].data_size);
        pos += frag->units[i].data_size;
    }
    mpp_assert(pos == size);
    frag->data_size = size;

    return 0;
}